

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QGate2.cpp
# Opt level: O1

void __thiscall
qclab::qgates::QGate2<float>::apply
          (QGate2<float> *this,Side side,Op op,int nbQubits,SquareMatrix<float> *matrix,int offset)

{
  float fVar1;
  float fVar2;
  float fVar3;
  int iVar4;
  float *pfVar5;
  long lVar6;
  _Head_base<0UL,_float_*,_false> _Var7;
  float *pfVar8;
  long lVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  char *__assertion;
  float *pfVar13;
  long lVar14;
  long lVar15;
  float *pfVar16;
  int64_t k;
  long lVar17;
  long lVar18;
  long lVar19;
  int iVar20;
  long lVar21;
  ulong uVar22;
  bool bVar23;
  float fVar24;
  SquareMatrix<float> mat2;
  vector<int,_std::allocator<int>_> qubits;
  SquareMatrix<float> local_a8;
  long local_98;
  long local_90;
  long local_88;
  long local_80;
  int local_74;
  SquareMatrix<float> local_70;
  SquareMatrix<float> local_60;
  int *local_50 [2];
  long local_40;
  long local_38;
  
  if (nbQubits < 2) {
    __assert_fail("nbQubits >= 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/QGate2.cpp"
                  ,0x23,
                  "virtual void qclab::qgates::QGate2<float>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = float]"
                 );
  }
  if (matrix->size_ != (long)(1 << ((byte)nbQubits & 0x1f))) {
    __assert_fail("matrix.size() == 1 << nbQubits",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/QGate2.cpp"
                  ,0x24,
                  "virtual void qclab::qgates::QGate2<float>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = float]"
                 );
  }
  (*(this->super_QObject<float>)._vptr_QObject[5])(local_50,this);
  iVar4 = *local_50[0] + offset;
  *local_50[0] = iVar4;
  iVar20 = offset + local_50[0][1];
  local_50[0][1] = iVar20;
  if (iVar4 < nbQubits) {
    if (iVar20 < nbQubits) {
      if (iVar4 + 1 != iVar20) {
        __assert_fail("qubits[0] + 1 == qubits[1]",
                      "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/QGate2.cpp"
                      ,0x29,
                      "virtual void qclab::qgates::QGate2<float>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = float]"
                     );
      }
      (*(this->super_QObject<float>)._vptr_QObject[7])(&local_a8);
      if ((op != NoTrans) && (1 < local_a8.size_)) {
        pfVar5 = (float *)((long)local_a8.data_._M_t.
                                 super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                                 super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                                 super__Head_base<0UL,_float_*,_false>._M_head_impl +
                          local_a8.size_ * 4);
        _Var7._M_head_impl = (float *)local_a8.data_;
        lVar6 = 0;
        do {
          lVar17 = 1;
          pfVar8 = pfVar5;
          do {
            fVar24 = _Var7._M_head_impl[lVar17];
            _Var7._M_head_impl[lVar17] = *pfVar8;
            *pfVar8 = fVar24;
            lVar15 = lVar6 + lVar17;
            lVar17 = lVar17 + 1;
            pfVar8 = pfVar8 + local_a8.size_;
          } while (lVar15 + 1 < local_a8.size_);
          pfVar5 = pfVar5 + local_a8.size_ + 1;
          _Var7._M_head_impl = _Var7._M_head_impl + local_a8.size_ + 1;
          bVar23 = lVar6 != local_a8.size_ + -2;
          lVar6 = lVar6 + 1;
        } while (bVar23);
      }
      if (side == Left) {
        if (nbQubits == 2) {
          lVar6 = matrix->size_;
          if (lVar6 != local_a8.size_) {
            __assert_fail("size_ == rhs.size()",
                          "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/dense/SquareMatrix.hpp"
                          ,0xb0,
                          "SquareMatrix<T> &qclab::dense::SquareMatrix<float>::operator*=(const SquareMatrix<T> &) [T = float]"
                         );
          }
          if (lVar6 == 0) {
            __assert_fail("size > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/dense/memory.hpp"
                          ,0x1e,"auto qclab::dense::init_unique_array(const int64_t) [T = float]");
          }
          uVar22 = 0xffffffffffffffff;
          if ((ulong)(lVar6 * lVar6) >> 0x3e == 0) {
            uVar22 = lVar6 * lVar6 * 4;
          }
          pfVar5 = (float *)operator_new__(uVar22);
          memset(pfVar5,0,uVar22);
          if (0 < lVar6) {
            pfVar8 = (matrix->data_)._M_t.
                     super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                     super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                     super__Head_base<0UL,_float_*,_false>._M_head_impl;
            lVar17 = 0;
            _Var7._M_head_impl =
                 (float *)local_a8.data_._M_t.
                          super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                          super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                          super__Head_base<0UL,_float_*,_false>._M_head_impl;
            do {
              lVar15 = 0;
              pfVar13 = pfVar8;
              do {
                fVar24 = pfVar5[lVar17 * lVar6 + lVar15];
                lVar18 = 0;
                pfVar16 = pfVar13;
                do {
                  fVar24 = fVar24 + *pfVar16 * _Var7._M_head_impl[lVar18];
                  pfVar5[lVar17 * lVar6 + lVar15] = fVar24;
                  lVar18 = lVar18 + 1;
                  pfVar16 = pfVar16 + lVar6;
                } while (lVar6 != lVar18);
                lVar15 = lVar15 + 1;
                pfVar13 = pfVar13 + 1;
              } while (lVar15 != lVar6);
              lVar17 = lVar17 + 1;
              _Var7._M_head_impl = _Var7._M_head_impl + local_a8.size_;
            } while (lVar17 != lVar6);
          }
          pfVar8 = (matrix->data_)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl;
          (matrix->data_)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
          super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
          super__Head_base<0UL,_float_*,_false>._M_head_impl = pfVar5;
          if (pfVar8 != (float *)0x0) {
            operator_delete__(pfVar8);
          }
        }
        else {
          iVar4 = ~local_50[0][1] + nbQubits;
          local_80 = CONCAT44(local_80._4_4_,iVar4);
          local_98 = matrix->size_;
          if (0 < local_98) {
            lVar17 = (long)(1 << ((byte)iVar4 & 0x1f));
            iVar20 = *local_50[0];
            local_90 = CONCAT44(local_90._4_4_,iVar20);
            uVar11 = 1 << ((byte)iVar20 & 0x1f);
            lVar6 = 1;
            if (1 < lVar17) {
              lVar6 = lVar17;
            }
            if ((int)uVar11 < 2) {
              uVar11 = 1;
            }
            lVar17 = lVar17 * local_98;
            lVar15 = lVar17 * 4;
            lVar10 = lVar17 * 8;
            lVar18 = lVar17 * 0xc;
            lVar21 = 0;
            lVar14 = 0;
            do {
              local_88 = lVar14;
              if (iVar20 != 0x1f) {
                pfVar5 = (matrix->data_)._M_t.
                         super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                         super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                         super__Head_base<0UL,_float_*,_false>._M_head_impl;
                uVar22 = 0;
                do {
                  lVar14 = lVar6;
                  pfVar8 = pfVar5;
                  if (iVar4 != 0x1f) {
                    do {
                      fVar24 = *(float *)((long)pfVar8 + lVar21);
                      fVar1 = *(float *)((long)pfVar8 + lVar15);
                      fVar2 = *(float *)((long)pfVar8 + lVar10);
                      fVar3 = *(float *)((long)pfVar8 + lVar18);
                      *(float *)((long)pfVar8 + lVar21) =
                           *(float *)((long)local_a8.data_._M_t.
                                            super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>
                                            .super__Head_base<0UL,_float_*,_false>._M_head_impl +
                                     0xc) * fVar3 +
                           *(float *)((long)local_a8.data_._M_t.
                                            super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>
                                            .super__Head_base<0UL,_float_*,_false>._M_head_impl + 8)
                           * fVar2 + *(float *)local_a8.data_._M_t.
                                               super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>
                                               .super__Head_base<0UL,_float_*,_false>._M_head_impl *
                                     fVar24 + *(float *)((long)local_a8.data_._M_t.
                                                                                                                              
                                                  super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>
                                                  .super__Head_base<0UL,_float_*,_false>.
                                                  _M_head_impl + 4) * fVar1;
                      *(float *)((long)pfVar8 + lVar15) =
                           ((float *)
                           ((long)local_a8.data_._M_t.
                                  super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                                  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                                  super__Head_base<0UL,_float_*,_false>._M_head_impl + 0xc))
                           [local_a8.size_] * fVar3 +
                           ((float *)
                           ((long)local_a8.data_._M_t.
                                  super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                                  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                                  super__Head_base<0UL,_float_*,_false>._M_head_impl + 8))
                           [local_a8.size_] * fVar2 +
                           *(float *)((long)local_a8.data_._M_t.
                                            super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>
                                            .super__Head_base<0UL,_float_*,_false>._M_head_impl +
                                     local_a8.size_ * 4) * fVar24 +
                           ((float *)
                           ((long)local_a8.data_._M_t.
                                  super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                                  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                                  super__Head_base<0UL,_float_*,_false>._M_head_impl + 4))
                           [local_a8.size_] * fVar1;
                      *(float *)((long)pfVar8 + lVar10) =
                           ((float *)
                           ((long)local_a8.data_._M_t.
                                  super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                                  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                                  super__Head_base<0UL,_float_*,_false>._M_head_impl + 0xc))
                           [local_a8.size_ * 2] * fVar3 +
                           ((float *)
                           ((long)local_a8.data_._M_t.
                                  super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                                  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                                  super__Head_base<0UL,_float_*,_false>._M_head_impl + 8))
                           [local_a8.size_ * 2] * fVar2 +
                           *(float *)((long)local_a8.data_._M_t.
                                            super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>
                                            .super__Head_base<0UL,_float_*,_false>._M_head_impl +
                                     local_a8.size_ * 8) * fVar24 +
                           ((float *)
                           ((long)local_a8.data_._M_t.
                                  super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                                  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                                  super__Head_base<0UL,_float_*,_false>._M_head_impl + 4))
                           [local_a8.size_ * 2] * fVar1;
                      *(float *)((long)pfVar8 + lVar18) =
                           fVar3 * ((float *)
                                   ((long)local_a8.data_._M_t.
                                          super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>
                                          .super__Head_base<0UL,_float_*,_false>._M_head_impl + 0xc)
                                   )[local_a8.size_ * 3] +
                           fVar2 * ((float *)
                                   ((long)local_a8.data_._M_t.
                                          super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>
                                          .super__Head_base<0UL,_float_*,_false>._M_head_impl + 8))
                                   [local_a8.size_ * 3] +
                           fVar24 * *(float *)((long)local_a8.data_._M_t.
                                                                                                          
                                                  super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>
                                                  .super__Head_base<0UL,_float_*,_false>.
                                                  _M_head_impl + local_a8.size_ * 0xc) +
                           fVar1 * ((float *)
                                   ((long)local_a8.data_._M_t.
                                          super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>
                                          .super__Head_base<0UL,_float_*,_false>._M_head_impl + 4))
                                   [local_a8.size_ * 3];
                      pfVar8 = pfVar8 + local_98;
                      lVar14 = lVar14 + -1;
                    } while (lVar14 != 0);
                  }
                  uVar22 = uVar22 + 1;
                  pfVar5 = pfVar5 + lVar17 * 4;
                } while (uVar22 != uVar11);
              }
              lVar21 = lVar21 + 4;
              lVar15 = lVar15 + 4;
              lVar10 = lVar10 + 4;
              lVar18 = lVar18 + 4;
              lVar14 = local_88 + 1;
            } while (local_88 + 1 != local_98);
          }
        }
      }
      else if (nbQubits == 2) {
        dense::SquareMatrix<float>::SquareMatrix(&local_70,&local_a8);
        dense::operator*((dense *)&local_60,&local_70,matrix);
        dense::SquareMatrix<float>::operator=(matrix,&local_60);
        if (local_60.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
            super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
            super__Head_base<0UL,_float_*,_false>._M_head_impl !=
            (__uniq_ptr_impl<float,_std::default_delete<float[]>_>)0x0) {
          operator_delete__((void *)local_60.data_._M_t.
                                    super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t
                                    .super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                                    super__Head_base<0UL,_float_*,_false>._M_head_impl);
        }
        local_60.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
        super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
        super__Head_base<0UL,_float_*,_false>._M_head_impl =
             (__uniq_ptr_data<float,_std::default_delete<float[]>,_true,_true>)
             (__uniq_ptr_impl<float,_std::default_delete<float[]>_>)0x0;
        if ((tuple<float_*,_std::default_delete<float[]>_>)
            local_70.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
            super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
            super__Head_base<0UL,_float_*,_false>._M_head_impl !=
            (_Head_base<0UL,_float_*,_false>)0x0) {
          operator_delete__((void *)local_70.data_._M_t.
                                    super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t
                                    .super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                                    super__Head_base<0UL,_float_*,_false>._M_head_impl);
        }
        local_70.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
        super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
        super__Head_base<0UL,_float_*,_false>._M_head_impl =
             (__uniq_ptr_data<float,_std::default_delete<float[]>,_true,_true>)
             (__uniq_ptr_impl<float,_std::default_delete<float[]>_>)0x0;
      }
      else {
        uVar11 = local_50[0][1];
        local_90 = matrix->size_;
        if (0 < local_90) {
          lVar17 = (long)(1 << ((byte)(~uVar11 + nbQubits) & 0x1f));
          local_74 = *local_50[0];
          uVar12 = 1 << ((byte)local_74 & 0x1f);
          lVar6 = 1;
          if (1 < lVar17) {
            lVar6 = lVar17;
          }
          local_80 = lVar17 * 4;
          if ((int)uVar12 < 2) {
            uVar12 = 1;
          }
          local_38 = local_90 * 4;
          lVar15 = lVar17 * 0x10;
          local_88 = lVar17 * 0xc;
          lVar17 = lVar17 << 3;
          local_98 = 0;
          lVar18 = 0;
          do {
            if (local_74 != 0x1f) {
              pfVar5 = (matrix->data_)._M_t.
                       super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                       super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                       super__Head_base<0UL,_float_*,_false>._M_head_impl;
              lVar14 = (long)pfVar5 + local_98;
              lVar10 = local_80 + (long)pfVar5;
              lVar21 = local_88 + (long)pfVar5;
              lVar19 = (long)pfVar5 + lVar17;
              uVar22 = 0;
              do {
                if (~uVar11 + nbQubits != 0x1f) {
                  lVar9 = 0;
                  do {
                    fVar24 = *(float *)(lVar14 + lVar9);
                    fVar1 = *(float *)(lVar10 + lVar9);
                    fVar2 = *(float *)(lVar19 + lVar9);
                    fVar3 = *(float *)(lVar21 + lVar9);
                    *(float *)(lVar14 + lVar9) =
                         *(float *)((long)local_a8.data_._M_t.
                                          super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>
                                          .super__Head_base<0UL,_float_*,_false>._M_head_impl +
                                   local_a8.size_ * 0xc) * fVar3 +
                         *(float *)((long)local_a8.data_._M_t.
                                          super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>
                                          .super__Head_base<0UL,_float_*,_false>._M_head_impl +
                                   local_a8.size_ * 8) * fVar2 +
                         *(float *)local_a8.data_._M_t.
                                   super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                                   super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                                   super__Head_base<0UL,_float_*,_false>._M_head_impl * fVar24 +
                         *(float *)((long)local_a8.data_._M_t.
                                          super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>
                                          .super__Head_base<0UL,_float_*,_false>._M_head_impl +
                                   local_a8.size_ * 4) * fVar1;
                    *(float *)(lVar10 + lVar9) =
                         ((float *)
                         ((long)local_a8.data_._M_t.
                                super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                                super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                                super__Head_base<0UL,_float_*,_false>._M_head_impl + 4))
                         [local_a8.size_ * 3] * fVar3 +
                         ((float *)
                         ((long)local_a8.data_._M_t.
                                super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                                super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                                super__Head_base<0UL,_float_*,_false>._M_head_impl + 4))
                         [local_a8.size_ * 2] * fVar2 +
                         *(float *)((long)local_a8.data_._M_t.
                                          super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>
                                          .super__Head_base<0UL,_float_*,_false>._M_head_impl + 4) *
                         fVar24 + ((float *)
                                  ((long)local_a8.data_._M_t.
                                         super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>
                                         .super__Head_base<0UL,_float_*,_false>._M_head_impl + 4))
                                  [local_a8.size_] * fVar1;
                    *(float *)(lVar19 + lVar9) =
                         ((float *)
                         ((long)local_a8.data_._M_t.
                                super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                                super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                                super__Head_base<0UL,_float_*,_false>._M_head_impl + 8))
                         [local_a8.size_ * 3] * fVar3 +
                         ((float *)
                         ((long)local_a8.data_._M_t.
                                super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                                super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                                super__Head_base<0UL,_float_*,_false>._M_head_impl + 8))
                         [local_a8.size_ * 2] * fVar2 +
                         *(float *)((long)local_a8.data_._M_t.
                                          super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>
                                          .super__Head_base<0UL,_float_*,_false>._M_head_impl + 8) *
                         fVar24 + ((float *)
                                  ((long)local_a8.data_._M_t.
                                         super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>
                                         .super__Head_base<0UL,_float_*,_false>._M_head_impl + 8))
                                  [local_a8.size_] * fVar1;
                    *(float *)(lVar21 + lVar9) =
                         fVar3 * ((float *)
                                 ((long)local_a8.data_._M_t.
                                        super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                                        _M_t.
                                        super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>
                                        .super__Head_base<0UL,_float_*,_false>._M_head_impl + 0xc))
                                 [local_a8.size_ * 3] +
                         fVar2 * ((float *)
                                 ((long)local_a8.data_._M_t.
                                        super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                                        _M_t.
                                        super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>
                                        .super__Head_base<0UL,_float_*,_false>._M_head_impl + 0xc))
                                 [local_a8.size_ * 2] +
                         fVar24 * *(float *)((long)local_a8.data_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>
                                                  .super__Head_base<0UL,_float_*,_false>.
                                                  _M_head_impl + 0xc) +
                         fVar1 * ((float *)
                                 ((long)local_a8.data_._M_t.
                                        super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                                        _M_t.
                                        super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>
                                        .super__Head_base<0UL,_float_*,_false>._M_head_impl + 0xc))
                                 [local_a8.size_];
                    lVar9 = lVar9 + 4;
                  } while (lVar6 * 4 != lVar9);
                }
                uVar22 = uVar22 + 1;
                lVar14 = lVar14 + lVar15;
                lVar10 = lVar10 + lVar15;
                lVar21 = lVar21 + lVar15;
                lVar19 = lVar19 + lVar15;
              } while (uVar22 != uVar12);
            }
            lVar18 = lVar18 + 1;
            local_98 = local_98 + local_38;
            local_80 = local_80 + local_38;
            local_88 = local_88 + local_38;
            lVar17 = lVar17 + local_38;
          } while (lVar18 != local_90);
        }
      }
      if ((_Head_base<0UL,_float_*,_false>)
          local_a8.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
          super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
          super__Head_base<0UL,_float_*,_false>._M_head_impl != (_Head_base<0UL,_float_*,_false>)0x0
         ) {
        operator_delete__((void *)local_a8.data_._M_t.
                                  super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                                  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                                  super__Head_base<0UL,_float_*,_false>._M_head_impl);
      }
      if (local_50[0] != (int *)0x0) {
        operator_delete(local_50[0],local_40 - (long)local_50[0]);
      }
      return;
    }
    __assertion = "qubits[1] < nbQubits";
  }
  else {
    __assertion = "qubits[0] < nbQubits";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/QGate2.cpp"
                ,0x28,
                "virtual void qclab::qgates::QGate2<float>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = float]"
               );
}

Assistant:

void QGate2< T >::apply( Side side , Op op , const int nbQubits ,
                           qclab::dense::SquareMatrix< T >& matrix ,
                           const int offset ) const {
    assert( nbQubits >= 2 ) ;
    assert( matrix.size() == 1 << nbQubits ) ;
    auto qubits = this->qubits() ;
    qubits[0] += offset ;
    qubits[1] += offset ;
    assert( qubits[0] < nbQubits ) ; assert( qubits[1] < nbQubits ) ;
    assert( qubits[0] + 1 == qubits[1] ) ;  // nearest neighbor qubtis
    // operation
    qclab::dense::SquareMatrix< T >  mat2 = this->matrix() ;
    qclab::dense::operateInPlace( op , mat2 ) ;
    // side
    if ( side == Side::Left ) {
      if ( nbQubits == 2 ) {
        matrix *= mat2 ;
      } else {
        // matrix *= kron( Ileft , mat2 , Iright )
        const int64_t nLeft  = 1 << qubits[0] ;
        const int64_t nRight = 1 << ( nbQubits - qubits[1] - 1 ) ;
        #pragma omp parallel for
        for ( int64_t i = 0; i < matrix.rows(); i++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            for ( int64_t j = 0; j < nRight; j++ ) {
              const int64_t j1 = j + 4 * k * nRight ;
              const int64_t j2 = j1 + nRight ;
              const int64_t j3 = j2 + nRight ;
              const int64_t j4 = j3 + nRight ;
              const T x1 = matrix(i,j1) ;
              const T x2 = matrix(i,j2) ;
              const T x3 = matrix(i,j3) ;
              const T x4 = matrix(i,j4) ;
              matrix(i,j1) = mat2(0,0) * x1 + mat2(1,0) * x2 +
                             mat2(2,0) * x3 + mat2(3,0) * x4 ;
              matrix(i,j2) = mat2(0,1) * x1 + mat2(1,1) * x2 +
                             mat2(2,1) * x3 + mat2(3,1) * x4 ;
              matrix(i,j3) = mat2(0,2) * x1 + mat2(1,2) * x2 +
                             mat2(2,2) * x3 + mat2(3,2) * x4 ;
              matrix(i,j4) = mat2(0,3) * x1 + mat2(1,3) * x2 +
                             mat2(2,3) * x3 + mat2(3,3) * x4 ;
            }
          }
        }
      }
    } else {
      if ( nbQubits == 2 ) {
        matrix = mat2 * matrix ;
      } else {
        // matrix = kron( Ileft , mat2 , Iright ) * matrix
        const int64_t nLeft  = 1 << qubits[0] ;
        const int64_t nRight = 1 << ( nbQubits - qubits[1] - 1 ) ;
        #pragma omp parallel for
        for ( int64_t j = 0; j < matrix.cols(); j++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            for ( int64_t i = 0; i < nRight; i++ ) {
              const int64_t i1 = i + 4 * k * nRight ;
              const int64_t i2 = i1 + nRight ;
              const int64_t i3 = i2 + nRight ;
              const int64_t i4 = i3 + nRight ;
              const T x1 = matrix(i1,j) ;
              const T x2 = matrix(i2,j) ;
              const T x3 = matrix(i3,j) ;
              const T x4 = matrix(i4,j) ;
              matrix(i1,j) = mat2(0,0) * x1 + mat2(0,1) * x2 +
                             mat2(0,2) * x3 + mat2(0,3) * x4 ;
              matrix(i2,j) = mat2(1,0) * x1 + mat2(1,1) * x2 +
                             mat2(1,2) * x3 + mat2(1,3) * x4 ;
              matrix(i3,j) = mat2(2,0) * x1 + mat2(2,1) * x2 +
                             mat2(2,2) * x3 + mat2(2,3) * x4 ;
              matrix(i4,j) = mat2(3,0) * x1 + mat2(3,1) * x2 +
                             mat2(3,2) * x3 + mat2(3,3) * x4 ;
            }
          }
        }
      }
    }
  }